

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resStrash.c
# Opt level: O0

Abc_Ntk_t * Res_WndStrash(Res_Win_t *p)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar5;
  int local_34;
  int i;
  Abc_Obj_t *pMiter;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pAig;
  Vec_Ptr_t *vPairs;
  Res_Win_t *p_local;
  
  iVar1 = Abc_NtkHasAig(p->pNode->pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasAig(p->pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resStrash.c"
                  ,0x37,"Abc_Ntk_t *Res_WndStrash(Res_Win_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar2 = Extra_UtilStrsav("window");
  pNtk->pName = pcVar2;
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vLeaves), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(p->vLeaves,local_34);
    pAVar4 = Abc_NtkCreatePi(pNtk);
    *(Abc_Obj_t **)((long)pvVar3 + 0x40) = pAVar4;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vBranches), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(p->vBranches,local_34);
    pAVar4 = Abc_NtkCreatePi(pNtk);
    *(Abc_Obj_t **)((long)pvVar3 + 0x40) = pAVar4;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vNodes), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,local_34);
    pAVar5 = Abc_ConvertAigToAig(pNtk,pAVar4);
    (pAVar4->field_6).pCopy = pAVar5;
    if (pAVar4 == p->pNode) {
      pAVar5 = Abc_ObjNot((pAVar4->field_6).pCopy);
      (pAVar4->field_6).pCopy = pAVar5;
    }
  }
  iVar1 = Vec_PtrSize(p->vRoots);
  p_00 = Vec_PtrAlloc(iVar1 << 1);
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vRoots), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(p->vRoots,local_34);
    Vec_PtrPush(p_00,*(void **)((long)pvVar3 + 0x40));
    Vec_PtrPush(p_00,(void *)0x0);
  }
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  Res_WinSweepLeafTfo_rec(p->pNode,(*(uint *)&p->pNode->field_0x14 >> 0xc) + p->nWinTfoMax);
  pAVar4 = Abc_ObjNot((p->pNode->field_6).pCopy);
  (p->pNode->field_6).pCopy = pAVar4;
  Abc_NodeSetTravIdPrevious(p->pNode);
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vNodes), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,local_34);
    iVar1 = Abc_NodeIsTravIdCurrent(pAVar4);
    if (iVar1 != 0) {
      pAVar5 = Abc_ConvertAigToAig(pNtk,pAVar4);
      (pAVar4->field_6).pCopy = pAVar5;
    }
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vRoots), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(p->vRoots,local_34);
    Vec_PtrWriteEntry(p_00,local_34 * 2 + 1,*(void **)((long)pvVar3 + 0x40));
  }
  pAVar4 = Abc_AigMiter((Abc_Aig_t *)pNtk->pManFunc,p_00,0);
  pAVar5 = Abc_NtkCreatePo(pNtk);
  Abc_ObjAddFanin(pAVar5,pAVar4);
  Vec_PtrFree(p_00);
  pAVar4 = Abc_NtkCreatePo(pNtk);
  Abc_ObjAddFanin(pAVar4,(p->pNode->field_6).pCopy);
  for (local_34 = 0; iVar1 = Abc_ObjFaninNum(p->pNode), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = Abc_ObjFanin(p->pNode,local_34);
    pAVar5 = Abc_NtkCreatePo(pNtk);
    Abc_ObjAddFanin(pAVar5,(pAVar4->field_6).pCopy);
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vDivs), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(p->vDivs,local_34);
    pAVar4 = Abc_NtkCreatePo(pNtk);
    Abc_ObjAddFanin(pAVar4,*(Abc_Obj_t **)((long)pvVar3 + 0x40));
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    fprintf(_stdout,"Res_WndStrash(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Res_WndStrash( Res_Win_t * p )
{
    Vec_Ptr_t * vPairs;
    Abc_Ntk_t * pAig;
    Abc_Obj_t * pObj, * pMiter;
    int i;
    assert( Abc_NtkHasAig(p->pNode->pNtk) );
//    Abc_NtkCleanCopy( p->pNode->pNtk );
    // create the network
    pAig = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pAig->pName = Extra_UtilStrsav( "window" );
    // create the inputs
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        pObj->pCopy = Abc_NtkCreatePi( pAig );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vBranches, pObj, i )
        pObj->pCopy = Abc_NtkCreatePi( pAig );
    // go through the nodes in the topological order
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        pObj->pCopy = Abc_ConvertAigToAig( pAig, pObj );
        if ( pObj == p->pNode )
            pObj->pCopy = Abc_ObjNot( pObj->pCopy );
    }
    // collect the POs
    vPairs = Vec_PtrAlloc( 2 * Vec_PtrSize(p->vRoots) );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        Vec_PtrPush( vPairs, pObj->pCopy );
        Vec_PtrPush( vPairs, NULL );
    }
    // mark the TFO of the node
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Res_WinSweepLeafTfo_rec( p->pNode, (int)p->pNode->Level + p->nWinTfoMax );
    // update strashing of the node
    p->pNode->pCopy = Abc_ObjNot( p->pNode->pCopy );
    Abc_NodeSetTravIdPrevious( p->pNode );
    // redo strashing in the TFO
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            pObj->pCopy = Abc_ConvertAigToAig( pAig, pObj );
    }
    // collect the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Vec_PtrWriteEntry( vPairs, 2 * i + 1, pObj->pCopy );
    // add the miter
    pMiter = Abc_AigMiter( (Abc_Aig_t *)pAig->pManFunc, vPairs, 0 );
    Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pMiter );
    Vec_PtrFree( vPairs );
    // add the node
    Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), p->pNode->pCopy );
    // add the fanins
    Abc_ObjForEachFanin( p->pNode, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pObj->pCopy );
    // add the divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pObj->pCopy );
    // add the names
    Abc_NtkAddDummyPiNames( pAig );
    Abc_NtkAddDummyPoNames( pAig );
    // check the resulting network
    if ( !Abc_NtkCheck( pAig ) )
        fprintf( stdout, "Res_WndStrash(): Network check has failed.\n" );
    return pAig;
}